

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1540::run(TestCase1540 *this)

{
  PointerType PVar1;
  bool bVar2;
  DebugExpression<bool> _kjCondition_4;
  DebugExpression<bool> _kjCondition;
  Builder root;
  MallocMessageBuilder builder;
  DebugExpression<bool> local_179;
  PointerReader local_178;
  PointerBuilder local_158;
  WirePointer *local_140;
  ushort local_134;
  int local_130;
  StructBuilder local_120 [2];
  StructBuilder in_stack_ffffffffffffff50;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)(local_120 + 1),0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_178,(MessageBuilder *)(local_120 + 1));
  local_158.pointer = local_178.pointer;
  local_158.segment = (SegmentBuilder *)local_178.segment;
  local_158.capTable = (CapTableBuilder *)local_178.capTable;
  PointerBuilder::initStruct(local_120,&local_158,(StructSize)0x140006);
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  local_158.pointer = local_120[0].pointers;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  bVar2 = PVar1 == NULL_;
  local_178.segment._0_1_ = bVar2;
  if ((!bVar2) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x609,ERROR,"\"failed: expected \" \"!(root.hasTextField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasTextField())",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 1;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment._0_1_ = PVar1 == NULL_;
  if ((!(bool)local_178.segment._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60a,ERROR,"\"failed: expected \" \"!(root.hasDataField())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasDataField())",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 2;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment._0_1_ = PVar1 == NULL_;
  if ((!(bool)local_178.segment._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[42],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\", _kjCondition",
               (char (*) [42])"failed: expected !(root.hasStructField())",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 7;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment = (SegmentReader *)CONCAT71(local_178.segment._1_7_,PVar1 == NULL_);
  if ((PVar1 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[40],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60c,ERROR,"\"failed: expected \" \"!(root.hasInt32List())\", _kjCondition",
               (char (*) [40])"failed: expected !(root.hasInt32List())",
               (DebugExpression<bool> *)&local_178);
  }
  StructBuilder::asReader(local_120);
  if (local_134 == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.pointer = local_140;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 == NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60e,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasTextField())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasTextField())",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 2) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 1;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 == NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60f,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasDataField())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasDataField())",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 3) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 2;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 == NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x610,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasStructField())\", _kjCondition",
               (char (*) [53])"failed: expected !(root.asReader().hasStructField())",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 8) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 7;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 == NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x611,ERROR,
               "\"failed: expected \" \"!(root.asReader().hasInt32List())\", _kjCondition",
               (char (*) [51])"failed: expected !(root.asReader().hasInt32List())",&local_179);
  }
  initTestMessage((Builder)in_stack_ffffffffffffff50);
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  local_158.pointer = local_120[0].pointers;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  bVar2 = PVar1 != NULL_;
  local_178.segment._0_1_ = bVar2;
  if ((!bVar2) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x615,ERROR,"\"failed: expected \" \"root.hasTextField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasTextField()",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 1;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment._0_1_ = PVar1 != NULL_;
  if ((!(bool)local_178.segment._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x616,ERROR,"\"failed: expected \" \"root.hasDataField()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasDataField()",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 2;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment._0_1_ = PVar1 != NULL_;
  if ((!(bool)local_178.segment._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x617,ERROR,"\"failed: expected \" \"root.hasStructField()\", _kjCondition",
               (char (*) [39])"failed: expected root.hasStructField()",
               (DebugExpression<bool> *)&local_178);
  }
  local_158.pointer = local_120[0].pointers + 7;
  local_158.segment = local_120[0].segment;
  local_158.capTable = local_120[0].capTable;
  PVar1 = PointerBuilder::getPointerType(&local_158);
  local_178.segment = (SegmentReader *)CONCAT71(local_178.segment._1_7_,PVar1 != NULL_);
  if ((PVar1 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x618,ERROR,"\"failed: expected \" \"root.hasInt32List()\", _kjCondition",
               (char (*) [37])"failed: expected root.hasInt32List()",
               (DebugExpression<bool> *)&local_178);
  }
  StructBuilder::asReader(local_120);
  if (local_134 == 0) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.pointer = local_140;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 != NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61a,ERROR,"\"failed: expected \" \"root.asReader().hasTextField()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasTextField()",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 2) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 1;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 != NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61b,ERROR,"\"failed: expected \" \"root.asReader().hasDataField()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasDataField()",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 3) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 2;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 != NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[50],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61c,ERROR,
               "\"failed: expected \" \"root.asReader().hasStructField()\", _kjCondition",
               (char (*) [50])"failed: expected root.asReader().hasStructField()",&local_179);
  }
  StructBuilder::asReader(local_120);
  if (local_134 < 8) {
    local_178.segment = (SegmentReader *)0x0;
    local_178.capTable = (CapTableReader *)0x0;
    local_178.pointer = (WirePointer *)0x0;
    local_178.nestingLimit = 0x7fffffff;
  }
  else {
    local_178.pointer = local_140 + 7;
    local_178.segment = &(local_158.segment)->super_SegmentReader;
    local_178.capTable = &(local_158.capTable)->super_CapTableReader;
    local_178.nestingLimit = local_130;
  }
  PVar1 = PointerReader::getPointerType(&local_178);
  local_179.value = PVar1 != NULL_;
  if ((!local_179.value) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x61d,ERROR,"\"failed: expected \" \"root.asReader().hasInt32List()\", _kjCondition"
               ,(char (*) [48])"failed: expected root.asReader().hasInt32List()",&local_179);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)(local_120 + 1));
  return;
}

Assistant:

TEST(Encoding, Has) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();

  EXPECT_FALSE(root.hasTextField());
  EXPECT_FALSE(root.hasDataField());
  EXPECT_FALSE(root.hasStructField());
  EXPECT_FALSE(root.hasInt32List());

  EXPECT_FALSE(root.asReader().hasTextField());
  EXPECT_FALSE(root.asReader().hasDataField());
  EXPECT_FALSE(root.asReader().hasStructField());
  EXPECT_FALSE(root.asReader().hasInt32List());

  initTestMessage(root);

  EXPECT_TRUE(root.hasTextField());
  EXPECT_TRUE(root.hasDataField());
  EXPECT_TRUE(root.hasStructField());
  EXPECT_TRUE(root.hasInt32List());

  EXPECT_TRUE(root.asReader().hasTextField());
  EXPECT_TRUE(root.asReader().hasDataField());
  EXPECT_TRUE(root.asReader().hasStructField());
  EXPECT_TRUE(root.asReader().hasInt32List());
}